

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_details::push_down_tail<int,false,6>
          (rrb_details *this,ref<immutable::rrb<int,_false,_6>_> *in,
          ref<immutable::rrb<int,_false,_6>_> *new_rrb,
          ref<immutable::rrb_details::leaf_node<int,_false>_> *new_tail)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long lVar3;
  byte bVar4;
  ref<immutable::rrb_details::leaf_node<int,_false>_> r;
  rrb<int,_false,_6> *prVar5;
  internal_node<int,_false> *piVar6;
  tree_node<int,_false> *ptVar7;
  rrb_size_table<false> *prVar8;
  leaf_node<int,_false> *plVar9;
  ref<immutable::rrb_details::internal_node<int,false>> *prVar10;
  ref<immutable::rrb_details::internal_node<int,_false>_> *to_set_00;
  ref<immutable::rrb_details::internal_node<int,_false>_> *to_set_1;
  ref<immutable::rrb_details::internal_node<int,_false>_> *node;
  ref<immutable::rrb_details::internal_node<int,_false>_> *to_set;
  ref<immutable::rrb_details::rrb_size_table<false>_> table;
  ref<immutable::rrb_details::internal_node<int,_false>_> new_root;
  uint local_60;
  uint32_t prev_shift;
  uint32_t child_index;
  uint32_t shift;
  ref<immutable::rrb_details::internal_node<int,_false>_> current;
  uint32_t pos;
  uint32_t nodes_visited;
  uint32_t nodes_to_copy;
  uint32_t index;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_30;
  ref<immutable::rrb_details::leaf_node<int,_false>_> old_tail;
  ref<immutable::rrb_details::leaf_node<int,_false>_> *new_tail_local;
  ref<immutable::rrb<int,_false,_6>_> *new_rrb_local;
  ref<immutable::rrb<int,_false,_6>_> *in_local;
  
  old_tail.ptr = (leaf_node<int,_false> *)new_tail;
  prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
  ref<immutable::rrb_details::leaf_node<int,_false>_>::ref(&local_30,&prVar5->tail);
  r = old_tail;
  prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
  ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
            (&prVar5->tail,(ref<immutable::rrb_details::leaf_node<int,_false>_> *)r.ptr);
  prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
  if ((prVar5->root).ptr == (tree_node<int,_false> *)0x0) {
    prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
    prVar5->shift = 0;
    prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
    ref<immutable::rrb_details::tree_node<int,false>>::operator=
              ((ref<immutable::rrb_details::tree_node<int,false>> *)&prVar5->root,&local_30);
    ref<immutable::rrb<int,_false,_6>_>::ref((ref<immutable::rrb<int,_false,_6>_> *)this,new_rrb);
  }
  else {
    prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
    nodes_visited = prVar5->cnt - 1;
    pos = 0;
    current.ptr._4_4_ = 0;
    current.ptr._0_4_ = 0;
    prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
    ref<immutable::rrb_details::internal_node<int,false>>::
    ref<immutable::rrb_details::tree_node<int,false>>
              ((ref<immutable::rrb_details::internal_node<int,false>> *)&child_index,&prVar5->root);
    prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
    for (prev_shift = prVar5->shift; 6 < prev_shift; prev_shift = prev_shift - 6) {
      piVar6 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&child_index);
      if ((piVar6->size_table).ptr == (rrb_size_table<false> *)0x0) {
        bVar4 = (byte)prev_shift;
        if (nodes_visited >> (bVar4 + 6 & 0x1f) != 0) {
          current.ptr._4_4_ = current.ptr._4_4_ + 1;
          goto LAB_0017d0ef;
        }
        local_60 = nodes_visited >> (bVar4 & 0x1f) & 0x3f;
        nodes_visited = (0x3f << (bVar4 & 0x1f) ^ 0xffffffffU) & nodes_visited;
      }
      else {
        piVar6 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&child_index)
        ;
        uVar1 = piVar6->len;
        local_60 = uVar1 - 1;
        if (local_60 != 0) {
          piVar6 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                              &child_index);
          prVar8 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                             (&piVar6->size_table);
          nodes_visited = nodes_visited - prVar8->size[uVar1 - 2];
        }
      }
      current.ptr._4_4_ = current.ptr._4_4_ + 1;
      if (local_60 < 0x3f) {
        current.ptr._0_4_ = local_60;
        pos = current.ptr._4_4_;
      }
      piVar6 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&child_index);
      if (local_60 < piVar6->len) {
        piVar6 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&child_index)
        ;
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&child_index,
                   piVar6->child + local_60);
      }
      else {
        ref<immutable::rrb_details::internal_node<int,_false>_>::ref(&new_root);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&child_index,&new_root
                  );
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&new_root);
      }
      if (_child_index == (internal_node<int,_false> *)0x0) {
        pos = current.ptr._4_4_;
        current.ptr._0_4_ = local_60;
        goto LAB_0017d0ef;
      }
    }
    if (prev_shift != 0) {
      current.ptr._4_4_ = current.ptr._4_4_ + 1;
      piVar6 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&child_index);
      if (piVar6->len < 0x40) {
        pos = current.ptr._4_4_;
        piVar6 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&child_index)
        ;
        current.ptr._0_4_ = piVar6->len;
      }
    }
LAB_0017d0ef:
    for (; 6 < prev_shift; prev_shift = prev_shift - 6) {
      current.ptr._4_4_ = current.ptr._4_4_ + 1;
    }
    if (pos == 0) {
      piVar6 = internal_node_create<int,false>(2);
      ref<immutable::rrb_details::internal_node<int,_false>_>::ref
                ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&table,piVar6);
      prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
      piVar6 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&table);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)piVar6->child,
                 &prVar5->root);
      prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
      ref<immutable::rrb_details::tree_node<int,false>>::operator=
                ((ref<immutable::rrb_details::tree_node<int,false>> *)&prVar5->root,
                 (ref<immutable::rrb_details::internal_node<int,_false>_> *)&table);
      prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
      uVar1 = prVar5->shift;
      prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
      prVar5->shift = uVar1 + 6;
      prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
      ptVar7 = ref<immutable::rrb_details::tree_node<int,_false>_>::operator->(&prVar5->root);
      if ((ptVar7->type != LEAF_NODE) &&
         (prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(in), ptVar7 = (prVar5->root).ptr,
         lVar3._0_4_ = ptVar7[1].type, lVar3._4_4_ = ptVar7[1].len, lVar3 != 0)) {
        prVar8 = size_table_create<false>(2);
        ref<immutable::rrb_details::rrb_size_table<false>_>::ref
                  ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&to_set,prVar8);
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
        uVar1 = prVar5->cnt;
        plVar9 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&local_30);
        uVar2 = plVar9->len;
        prVar8 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&to_set);
        *prVar8->size = uVar1 - uVar2;
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
        uVar1 = prVar5->cnt;
        prVar8 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&to_set);
        prVar8->size[1] = uVar1;
        piVar6 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&table);
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar6->size_table,
                   (ref<immutable::rrb_details::rrb_size_table<false>_> *)&to_set);
        ref<immutable::rrb_details::rrb_size_table<false>_>::~ref
                  ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&to_set);
      }
      prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(new_rrb);
      prVar10 = (ref<immutable::rrb_details::internal_node<int,false>> *)
                append_empty<int,false>
                          ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                           (*(long *)&(prVar5->root).ptr[1]._ref_count + 8),current.ptr._4_4_);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=(prVar10,&local_30);
      ref<immutable::rrb_details::internal_node<int,_false>_>::~ref
                ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&table);
    }
    else {
      plVar9 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&local_30);
      to_set_00 = copy_first_k<int,false,6>(in,new_rrb,pos,plVar9->len);
      prVar10 = (ref<immutable::rrb_details::internal_node<int,false>> *)
                append_empty<int,false>(to_set_00,current.ptr._4_4_ - pos);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=(prVar10,&local_30);
    }
    ref<immutable::rrb<int,_false,_6>_>::ref((ref<immutable::rrb<int,_false,_6>_> *)this,new_rrb);
    ref<immutable::rrb_details::internal_node<int,_false>_>::~ref
              ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&child_index);
  }
  ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref(&local_30);
  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> push_down_tail(const ref<rrb<T, atomic_ref_counting, N>>& in, const ref<rrb<T, atomic_ref_counting, N>>& new_rrb, const ref<leaf_node<T, atomic_ref_counting>>& new_tail)
      {
      ref<leaf_node<T, atomic_ref_counting>> old_tail = new_rrb->tail;
      new_rrb->tail = new_tail;
      //if (in->cnt <= bits<N>::rrb_branching)
      if (in->root.ptr == nullptr) // [JanM] old code is commented out above. Fixed this due to bug, see unit test test_bug_concat in vector_tests.cpp
        {
        new_rrb->shift = 0;
        new_rrb->root = old_tail;
        return new_rrb;
        }

      // Copyable count starts here

      // TODO: Can find last rightmost jump in constant time for pvec subvecs:
      // use the fact that (index & large_mask) == 1 << (RRB_BITS * H) - 1 -> 0 etc.

      uint32_t index = in->cnt - 1;

      uint32_t nodes_to_copy = 0;
      uint32_t nodes_visited = 0;
      uint32_t pos = 0; // pos is the position we insert empty nodes in the bottom
                        // copyable node (or the element, if we can copy the leaf)
      ref<internal_node<T, atomic_ref_counting>> current = in->root;
      uint32_t shift = in->shift;

      // checking all non-leaf nodes (or if tail, all but the lowest two levels)
      while (shift > bits<N>::rrb_bits)
        {
        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          // some check here to ensure we're not overflowing the pvec subvec.
          // important to realise that this only needs to be done once in a better
          // impl, the same way the size_table check only has to be done until it's
          // false.
          const uint32_t prev_shift = shift + bits<N>::rrb_bits;
          if (index >> prev_shift > 0)
            {
            nodes_visited++; // this could possibly be done earlier in the code.
            goto copyable_count_end;
            }
          child_index = (index >> shift) & bits<N>::rrb_mask;
          // index filtering is not necessary when the check above is performed at
          // most once.
          index &= ~(bits<N>::rrb_mask << shift);
          }
        else
          {
          // no need for sized_pos here, luckily.
          child_index = current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        nodes_visited++;
        if (child_index < bits<N>::rrb_mask)
          {
          nodes_to_copy = nodes_visited;
          pos = child_index;
          }

        if (child_index < current->len)
          current = current->child[child_index];
        else
          current = ref<internal_node<T, atomic_ref_counting>>();
        // This will only happen in a pvec subtree
        if (current.ptr == nullptr)
          {
          nodes_to_copy = nodes_visited;
          pos = child_index;

          // if next element we're looking at is null, we can copy all above. Good
          // times.
          goto copyable_count_end;
          }
        shift -= bits<N>::rrb_bits;
        }
      // if we're here, we're at the leaf node (or lowest non-leaf), which is
      // `current`

      // no need to even use index here: We know it'll be placed at current->len,
      // if there's enough space. That check is easy.
      if (shift != 0)
        {
        nodes_visited++;
        if (current->len < bits<N>::rrb_branching)
          {
          nodes_to_copy = nodes_visited;
          pos = current->len;
          }
        }

    copyable_count_end:
      // GURRHH, nodes_visited is not yet handled nicely. for loop down to get
      // nodes_visited set straight.
      while (shift > bits<N>::rrb_bits)
        {
        nodes_visited++;
        shift -= bits<N>::rrb_bits;
        }

      // Increasing height of tree.
      if (nodes_to_copy == 0)
        {
        ref<internal_node<T, atomic_ref_counting>> new_root = internal_node_create<T, atomic_ref_counting>(2);
        new_root->child[0] = in->root;
        new_rrb->root = new_root;
        new_rrb->shift = new_rrb->shift + bits<N>::rrb_bits;

        // create size table if the original rrb root has a size table.
        if (in->root->type != LEAF_NODE && ((const internal_node<T, atomic_ref_counting> *)in->root.ptr)->size_table.ptr != nullptr)
          {
          ref<rrb_size_table<atomic_ref_counting>> table = size_table_create<atomic_ref_counting>(2);
          table->size[0] = in->cnt - old_tail->len;
          // If we insert the tail, the old size minus the old tail size will be the
          // amount of elements in the left branch. If there is no tail, the size is
          // just the old rrb-tree.

          table->size[1] = in->cnt;
          // If we insert the tail, the old size would include the tail.
          // Consequently, it has to be the old size. If we have no tail, we append
          // a single element to the old vector, therefore it has to be one more
          // than the original.

          new_root->size_table = table;
          }

        // nodes visited == original rrb tree height. Nodes visited > 0.
        ref<internal_node<T, atomic_ref_counting>>* to_set = append_empty(&((internal_node<T, atomic_ref_counting> *)new_rrb->root.ptr)->child[1], nodes_visited);
        *to_set = old_tail;
        }
      else
        {
        ref<internal_node<T, atomic_ref_counting>>* node = copy_first_k(in, new_rrb, nodes_to_copy, old_tail->len);
        ref<internal_node<T, atomic_ref_counting>>* to_set = append_empty(node, nodes_visited - nodes_to_copy);
        *to_set = old_tail;
        }
      return new_rrb;
      }